

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  int iVar1;
  int iVar2;
  limitedOutput_directive outputDirective;
  tableType_t tableType;
  dictIssue_directive dictIssue;
  
  iVar2 = 1;
  if (1 < acceleration) {
    iVar2 = acceleration;
  }
  if (0x10000 < iVar2) {
    iVar2 = 0x10001;
  }
  iVar1 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar1 = (uint)((ulong)(uint)srcSize * 0x8080808081 >> 0x27) + 0x10;
  }
  if (iVar1 <= dstCapacity) {
    if (0x1000a < srcSize) {
      LZ4_prepareTable((LZ4_stream_t_internal *)state,srcSize,byU32);
      outputDirective = notLimited;
      dstCapacity = 0;
      dictIssue = noDictIssue;
      tableType = byU32;
      goto LAB_010fc586;
    }
    if (*(int *)((long)state + 0x4014) == 3) {
      iVar1 = *(int *)((long)state + 0x4010);
      if (srcSize < 0x1000 && (uint)(iVar1 + srcSize) < 0xffff) goto LAB_010fc50e;
LAB_010fc4fd:
      switchD_005681f0::default(state,0,0x401c);
LAB_010fc52a:
      dictIssue = noDictIssue;
    }
    else {
      if (*(int *)((long)state + 0x4014) != 0) goto LAB_010fc4fd;
      iVar1 = *(int *)((long)state + 0x4010);
LAB_010fc50e:
      *(undefined4 *)((long)state + 0x4018) = 0;
      *(undefined8 *)((long)state + 0x4000) = 0;
      *(undefined8 *)((long)state + 0x4008) = 0;
      if (iVar1 == 0) goto LAB_010fc52a;
      dictIssue = dictSmall;
    }
    dstCapacity = 0;
    outputDirective = notLimited;
LAB_010fc583:
    tableType = byU16;
    goto LAB_010fc586;
  }
  if (srcSize < 0x1000b) {
    if (*(int *)((long)state + 0x4014) == 3) {
      iVar1 = *(int *)((long)state + 0x4010);
      if (srcSize < 0x1000 && (uint)(iVar1 + srcSize) < 0xffff) goto LAB_010fc498;
LAB_010fc487:
      switchD_005681f0::default(state,0,0x401c);
    }
    else {
      if (*(int *)((long)state + 0x4014) != 0) goto LAB_010fc487;
      iVar1 = *(int *)((long)state + 0x4010);
LAB_010fc498:
      *(undefined4 *)((long)state + 0x4018) = 0;
      *(undefined8 *)((long)state + 0x4000) = 0;
      *(undefined8 *)((long)state + 0x4008) = 0;
      if (iVar1 != 0) {
        outputDirective = limitedOutput;
        dictIssue = dictSmall;
        goto LAB_010fc583;
      }
    }
    tableType = byU16;
  }
  else {
    LZ4_prepareTable((LZ4_stream_t_internal *)state,srcSize,byU32);
    tableType = byU32;
  }
  dictIssue = noDictIssue;
  outputDirective = limitedOutput;
LAB_010fc586:
  iVar2 = LZ4_compress_generic
                    ((LZ4_stream_t_internal *)state,src,dst,srcSize,(int *)0x0,dstCapacity,
                     outputDirective,tableType,noDict,dictIssue,iVar2);
  return iVar2;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}